

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string_n.hpp
# Opt level: O2

void __thiscall dna_string_n::build_rank_support(dna_string_n *this)

{
  pointer ppVar1;
  p_rank_n r;
  p_rank_n r_00;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  ulong block_number;
  ulong uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  p_rank_n local_rank;
  
  uVar8 = 0;
  lVar2 = 0;
  lVar4 = 0;
  lVar5 = 0;
  lVar6 = 0;
  uVar7 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar12 = 0;
  uVar13 = 0;
  for (uVar11 = 0; uVar3 = this->n_blocks - 1, uVar11 < uVar3; uVar11 = uVar11 + 1) {
    uVar3 = uVar11 >> 0x19;
    block_number = uVar11 & 0x1ffffff;
    if (block_number == 0) {
      ppVar1 = (this->superblock_ranks).super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar1[uVar3].A = uVar13;
      ppVar1[uVar3].C = uVar12;
      ppVar1[uVar3].G = uVar10;
      ppVar1[uVar3].N = uVar9;
      ppVar1[uVar3].T = uVar7;
      uVar8 = 0;
      lVar2 = 0;
      lVar4 = 0;
      lVar5 = 0;
      lVar6 = 0;
    }
    r.C = lVar5;
    r.A = lVar6;
    r.G = lVar4;
    r.N = lVar2;
    r.T = uVar8;
    set_counters(this,uVar3,block_number,r);
    block_rank(&local_rank,this,uVar3,block_number,0x75);
    lVar6 = lVar6 + local_rank.A;
    uVar13 = uVar13 + local_rank.A;
    lVar5 = lVar5 + local_rank.C;
    uVar12 = uVar12 + local_rank.C;
    lVar4 = lVar4 + local_rank.G;
    uVar10 = uVar10 + local_rank.G;
    lVar2 = lVar2 + local_rank.N;
    uVar9 = uVar9 + local_rank.N;
    uVar8 = uVar8 + local_rank.T;
    uVar7 = uVar7 + local_rank.T;
  }
  uVar11 = uVar3 >> 0x19;
  if ((uVar3 & 0x1ffffff) == 0) {
    ppVar1 = (this->superblock_ranks).super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar1[uVar11].A = uVar13;
    ppVar1[uVar11].C = uVar12;
    ppVar1[uVar11].G = uVar10;
    ppVar1[uVar11].N = uVar9;
    ppVar1[uVar11].T = uVar7;
    uVar8 = 0;
    lVar2 = 0;
    lVar4 = 0;
    lVar5 = 0;
    lVar6 = 0;
  }
  r_00.C = lVar5;
  r_00.A = lVar6;
  r_00.G = lVar4;
  r_00.N = lVar2;
  r_00.T = uVar8;
  set_counters(this,uVar11,uVar3 & 0x1ffffff,r_00);
  return;
}

Assistant:

void build_rank_support(){

		p_rank_n superblock_r = {};
		p_rank_n block_r = {};

		for(uint64_t bl = 0; bl < n_blocks-1; ++bl){

			uint64_t superblock_number = bl/BLOCKS_PER_SUPERBLOCK_N;
			uint64_t block_number = bl%BLOCKS_PER_SUPERBLOCK_N;

			if(block_number == 0){

				superblock_ranks[superblock_number]=superblock_r;
				block_r = {};

			}

			set_counters(superblock_number, block_number,block_r);

			p_rank_n local_rank = block_rank(superblock_number, block_number);

			block_r = block_r + local_rank;
			superblock_r = superblock_r + local_rank;

		}

		uint64_t superblock_number = (n_blocks-1)/BLOCKS_PER_SUPERBLOCK_N;
		uint64_t block_number = (n_blocks-1)%BLOCKS_PER_SUPERBLOCK_N;

		if(block_number == 0){

			superblock_ranks[superblock_number]=superblock_r;
			block_r = {};

		}

		set_counters(superblock_number, block_number,block_r);

	}